

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  ulong *puVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  ulong *puVar7;
  ulong uVar8;
  int *piVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  BYTE *e;
  ulong *puVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong uVar22;
  long lVar23;
  ulong *puVar24;
  ulong uVar25;
  char cVar26;
  BYTE *e_1;
  int iVar27;
  ulong *puVar28;
  long lVar29;
  ulong *puVar30;
  char *pcVar31;
  long lVar32;
  char *local_b0;
  U32 *hashTable;
  int local_70;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  uVar19 = (LZ4_dict->internal_donotuse).dictSize;
  uVar25 = (ulong)uVar19;
  iVar6 = (int)dest;
  puVar30 = (ulong *)source;
  local_b0 = dest;
  if (uVar25 < 0x10000) {
    uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
    if (uVar2 <= uVar19) goto LAB_002a8def;
    if (0x7e000000 < (uint)srcSize) goto LAB_002a8df7;
    if (srcSize != 0) {
      piVar3 = (int *)(LZ4_dict->internal_donotuse).dictionary;
      lVar29 = uVar25 + (long)piVar3;
      lVar14 = lVar29 - (ulong)uVar2;
      if (piVar3 == (int *)0x0) {
        lVar14 = 0;
      }
      (LZ4_dict->internal_donotuse).dictSize = uVar19 + srcSize;
      (LZ4_dict->internal_donotuse).currentOffset = uVar2 + srcSize;
      (LZ4_dict->internal_donotuse).tableType = 2;
      if (0xc < (uint)srcSize) {
        lVar32 = (long)source - (ulong)uVar2;
        puVar7 = (ulong *)(source + ((ulong)(uint)srcSize - 5));
        if (piVar3 == (int *)0x0) {
          lVar29 = 0;
        }
        *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar2;
        puVar1 = (ulong *)(source + ((ulong)(uint)srcSize - 0xc));
LAB_002a88d9:
        uVar22 = 1;
        uVar25 = *(ulong *)((long)puVar30 + 1);
        uVar8 = 0x40;
        puVar24 = (ulong *)((long)puVar30 + 1);
        do {
          puVar28 = (ulong *)(uVar22 + (long)puVar24);
          dest = local_b0;
          if (source + ((ulong)(uint)srcSize - 0xb) < puVar28) break;
          uVar22 = uVar25 * -0x30e4432345000000 >> 0x34;
          iVar27 = (int)puVar24;
          iVar13 = (int)lVar32;
          uVar11 = iVar27 - iVar13;
          uVar18 = *(uint *)((long)LZ4_dict + uVar22 * 4);
          uVar25 = *puVar28;
          *(uint *)((long)LZ4_dict + uVar22 * 4) = uVar11;
          if ((uVar2 - uVar19 <= uVar18) && (uVar11 <= uVar18 + 0xffff)) {
            lVar23 = lVar14;
            if (uVar2 <= uVar18) {
              lVar23 = lVar32;
            }
            if (*(int *)(lVar23 + (ulong)uVar18) == (int)*puVar24) goto LAB_002a8955;
          }
          uVar22 = uVar8 >> 6;
          uVar8 = (ulong)((int)uVar8 + 1);
          puVar24 = puVar28;
        } while( true );
      }
LAB_002a9460:
      pcVar31 = source + ((ulong)(uint)srcSize - (long)puVar30);
      if (pcVar31 < (char *)0xf) {
        *dest = (char)pcVar31 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar10 = pcVar31 + -0xf; dest = dest + 1, (char *)0xfe < pcVar10;
            pcVar10 = pcVar10 + -0xff) {
          *dest = -1;
        }
        *dest = (char)pcVar10;
      }
LAB_002a949b:
      memcpy(dest + 1,puVar30,(size_t)pcVar31);
      iVar6 = ((int)(dest + 1) + (int)pcVar31) - iVar6;
      goto LAB_002a94a9;
    }
  }
  else {
LAB_002a8def:
    if (0x7e000000 < (uint)srcSize) {
LAB_002a8df7:
      iVar6 = 0;
      goto LAB_002a94a9;
    }
    if (srcSize != 0) {
      uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
      piVar3 = (int *)(LZ4_dict->internal_donotuse).dictionary;
      lVar29 = uVar25 + (long)piVar3;
      lVar14 = lVar29 - (ulong)uVar2;
      if (piVar3 == (int *)0x0) {
        lVar14 = 0;
      }
      (LZ4_dict->internal_donotuse).dictSize = uVar19 + srcSize;
      (LZ4_dict->internal_donotuse).currentOffset = uVar2 + srcSize;
      (LZ4_dict->internal_donotuse).tableType = 2;
      if (0xc < (uint)srcSize) {
        lVar32 = (long)source - (ulong)uVar2;
        puVar7 = (ulong *)(source + ((ulong)(uint)srcSize - 5));
        if (piVar3 == (int *)0x0) {
          lVar29 = 0;
        }
        *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar2;
        puVar1 = (ulong *)(source + ((ulong)(uint)srcSize - 0xc));
LAB_002a8ef3:
        uVar25 = *(ulong *)((long)puVar30 + 1);
        uVar8 = 0x40;
        uVar22 = 1;
        puVar24 = (ulong *)((long)puVar30 + 1);
        do {
          puVar28 = (ulong *)(uVar22 + (long)puVar24);
          dest = local_b0;
          if (source + ((ulong)(uint)srcSize - 0xb) < puVar28) break;
          uVar22 = uVar25 * -0x30e4432345000000 >> 0x34;
          iVar27 = (int)puVar24;
          local_70 = (int)lVar32;
          uVar18 = iVar27 - local_70;
          uVar19 = *(uint *)((long)LZ4_dict + uVar22 * 4);
          uVar25 = *puVar28;
          *(uint *)((long)LZ4_dict + uVar22 * 4) = uVar18;
          if (uVar18 <= uVar19 + 0xffff) {
            lVar23 = lVar14;
            if (uVar2 <= uVar19) {
              lVar23 = lVar32;
            }
            if (*(int *)(lVar23 + (ulong)uVar19) == (int)*puVar24) goto LAB_002a8f6a;
          }
          uVar22 = uVar8 >> 6;
          uVar8 = (ulong)((int)uVar8 + 1);
          puVar24 = puVar28;
        } while( true );
      }
LAB_002a940f:
      pcVar31 = source + ((ulong)(uint)srcSize - (long)puVar30);
      if (pcVar31 < (char *)0xf) {
        *dest = (char)pcVar31 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar10 = pcVar31 + -0xf; dest = dest + 1, (char *)0xfe < pcVar10;
            pcVar10 = pcVar10 + -0xff) {
          *dest = -1;
        }
        *dest = (char)pcVar10;
      }
      goto LAB_002a949b;
    }
  }
  *dest = '\0';
  iVar6 = 1;
LAB_002a94a9:
  (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return iVar6;
LAB_002a8f6a:
  lVar23 = lVar23 + (ulong)uVar19;
  piVar15 = (int *)source;
  if (uVar19 < uVar2) {
    piVar15 = piVar3;
  }
  iVar13 = uVar18 - uVar19;
  iVar12 = (int)puVar30;
  lVar4 = 0;
  cVar5 = (char)puVar24 * '\x10' + (char)puVar30 * -0x10;
  do {
    cVar26 = cVar5;
    lVar17 = lVar4;
    piVar9 = (int *)(lVar23 + lVar17);
    puVar28 = (ulong *)((long)puVar24 + lVar17);
    if ((piVar9 <= piVar15) || (puVar28 <= puVar30)) break;
    lVar4 = lVar17 + -1;
    cVar5 = cVar26 + -0x10;
  } while (*(char *)((long)puVar24 + lVar17 + -1) == *(char *)(lVar23 + -1 + lVar17));
  if ((uint)((iVar27 - iVar12) + (int)lVar17) < 0xf) {
    puVar24 = (ulong *)(local_b0 + 1);
    *local_b0 = cVar26;
  }
  else {
    *local_b0 = -0x10;
    puVar24 = (ulong *)(local_b0 + 2);
    for (iVar27 = (iVar27 - iVar12) + (int)lVar17 + -0xf; 0xfe < iVar27; iVar27 = iVar27 + -0xff) {
      *(char *)((long)puVar24 + -1) = -1;
      puVar24 = (ulong *)((long)puVar24 + 1);
    }
    *(char *)((long)puVar24 + -1) = (char)iVar27;
  }
  puVar16 = (ulong *)((ulong)(uint)((int)puVar28 - iVar12) + (long)puVar24);
  do {
    *puVar24 = *puVar30;
    puVar24 = puVar24 + 1;
    puVar30 = puVar30 + 1;
  } while (puVar24 < puVar16);
  do {
    *(short *)puVar16 = (short)iVar13;
    if (piVar15 == piVar3) {
      puVar24 = (ulong *)((lVar29 - (long)piVar9) + (long)puVar28);
      if (puVar7 < puVar24) {
        puVar24 = puVar7;
      }
      puVar30 = (ulong *)((long)puVar28 + 4);
      puVar20 = (ulong *)(piVar9 + 1);
      puVar21 = puVar30;
      if ((ulong *)((long)puVar24 - 7U) <= puVar30) {
LAB_002a90d7:
        iVar27 = ((int)puVar21 - (int)puVar28) + -4;
LAB_002a90e1:
        if (puVar21 < (ulong *)((long)puVar24 - 7U)) {
          if (*puVar20 == *puVar21) break;
          uVar22 = *puVar21 ^ *puVar20;
          uVar25 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar25 = (ulong)(((uint)(uVar25 >> 3) & 0x1fffffff) + iVar27);
        }
        else {
          if ((puVar21 < (ulong *)((long)puVar24 - 3U)) && ((int)*puVar20 == (int)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar21 < (ulong *)((long)puVar24 - 1U)) && ((short)*puVar20 == (short)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar21 < puVar24) {
            puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar20 == (char)*puVar21));
          }
          uVar25 = (ulong)(uint)((int)puVar21 - (int)puVar30);
        }
        goto LAB_002a9147;
      }
      if (*puVar20 == *puVar30) {
        puVar20 = (ulong *)(piVar9 + 3);
        puVar21 = (ulong *)((long)puVar28 + 0xc);
        goto LAB_002a90d7;
      }
      uVar22 = *puVar30 ^ *puVar20;
      uVar25 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      uVar25 = uVar25 >> 3 & 0x1fffffff;
LAB_002a9147:
      uVar19 = (uint)uVar25;
      puVar30 = (ulong *)((long)puVar28 + uVar25 + 4);
      if (puVar30 == puVar24) {
        puVar30 = puVar24;
        puVar20 = (ulong *)source;
        if (puVar1 <= puVar24) {
LAB_002a917c:
          puVar28 = (ulong *)((long)puVar28 + (lVar29 - (long)piVar9));
          if (puVar7 <= puVar28) {
            puVar28 = puVar7;
          }
          iVar27 = (int)puVar30 - (int)puVar28;
LAB_002a9194:
          if (puVar30 < puVar1) {
            if (*puVar20 == *puVar30) goto code_r0x002a91a8;
            uVar22 = *puVar30 ^ *puVar20;
            uVar25 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar18 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar27;
          }
          else {
            if ((puVar30 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar20 == (int)*puVar30))
            {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar30 < source + ((ulong)(uint)srcSize - 6)) &&
               ((short)*puVar20 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar30 < puVar7) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar20 == (char)*puVar30));
            }
            uVar18 = (int)puVar30 - (int)puVar24;
          }
          goto LAB_002a91cd;
        }
        if (*(ulong *)source == *puVar24) {
          puVar30 = puVar24 + 1;
          puVar20 = (ulong *)(source + 8);
          goto LAB_002a917c;
        }
        uVar22 = *puVar24 ^ *(ulong *)source;
        uVar25 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        uVar18 = (uint)(uVar25 >> 3) & 0x1fffffff;
LAB_002a91cd:
        uVar19 = uVar19 + uVar18;
        puVar30 = (ulong *)((long)puVar24 + (ulong)uVar18);
      }
    }
    else {
      puVar30 = (ulong *)((long)puVar28 + 4);
      puVar24 = (ulong *)(piVar9 + 1);
      puVar20 = puVar30;
      if (puVar1 <= puVar30) {
LAB_002a906c:
        iVar27 = ((int)puVar20 - (int)puVar28) + -4;
LAB_002a9073:
        if (puVar20 < puVar1) {
          if (*puVar24 == *puVar20) goto code_r0x002a908b;
          uVar22 = *puVar20 ^ *puVar24;
          uVar25 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar25 = (ulong)(((uint)(uVar25 >> 3) & 0x1fffffff) + iVar27);
        }
        else {
          if ((puVar20 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar24 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar24 = (ulong *)((long)puVar24 + 4);
          }
          if ((puVar20 < source + ((ulong)(uint)srcSize - 6)) &&
             ((short)*puVar24 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar24 = (ulong *)((long)puVar24 + 2);
          }
          if (puVar20 < puVar7) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar24 == (char)*puVar20));
          }
          uVar25 = (ulong)(uint)((int)puVar20 - (int)puVar30);
        }
        goto LAB_002a9120;
      }
      if (*puVar24 == *puVar30) {
        puVar24 = (ulong *)(piVar9 + 3);
        puVar20 = (ulong *)((long)puVar28 + 0xc);
        goto LAB_002a906c;
      }
      uVar22 = *puVar30 ^ *puVar24;
      uVar25 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      uVar25 = uVar25 >> 3 & 0x1fffffff;
LAB_002a9120:
      uVar19 = (uint)uVar25;
      puVar30 = (ulong *)((long)puVar28 + uVar25 + 4);
    }
    dest = (char *)((long)puVar16 + 2);
    if (uVar19 < 0xf) {
      *local_b0 = *local_b0 + (char)uVar19;
    }
    else {
      *local_b0 = *local_b0 + '\x0f';
      dest[0] = -1;
      dest[1] = -1;
      dest[2] = -1;
      dest[3] = -1;
      lVar23 = 0;
      for (uVar18 = uVar19 - 0xf; 0x3fb < uVar18; uVar18 = uVar18 - 0x3fc) {
        pcVar31 = (char *)((long)puVar16 + lVar23 + 6);
        pcVar31[0] = -1;
        pcVar31[1] = -1;
        pcVar31[2] = -1;
        pcVar31[3] = -1;
        lVar23 = lVar23 + 4;
      }
      lVar4 = lVar23 + (ulong)(uVar18 & 0xffff) / 0xff;
      dest = (char *)((long)puVar16 + lVar4 + 3);
      *(char *)((long)puVar16 + lVar4 + 2) =
           (char)((ushort)uVar18 / 0xff) + (char)uVar19 + -0xf + (char)lVar23;
    }
    if (source + ((ulong)(uint)srcSize - 0xb) <= puVar30) goto LAB_002a940f;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar30 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar30 + -2) - local_70;
    uVar25 = *puVar30 * -0x30e4432345000000 >> 0x34;
    uVar18 = (int)puVar30 - local_70;
    uVar19 = *(uint *)((long)LZ4_dict + uVar25 * 4);
    piVar15 = (int *)source;
    lVar23 = lVar32;
    if (uVar19 < uVar2) {
      piVar15 = piVar3;
      lVar23 = lVar14;
    }
    piVar9 = (int *)(lVar23 + (ulong)uVar19);
    *(uint *)((long)LZ4_dict + uVar25 * 4) = uVar18;
    local_b0 = dest;
    if ((uVar19 + 0xffff < uVar18) || (*piVar9 != (int)*puVar30)) goto LAB_002a8ef3;
    puVar16 = (ulong *)(dest + 1);
    *dest = '\0';
    iVar13 = uVar18 - uVar19;
    puVar28 = puVar30;
  } while( true );
  puVar21 = puVar21 + 1;
  puVar20 = puVar20 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_002a90e1;
code_r0x002a91a8:
  puVar30 = puVar30 + 1;
  puVar20 = puVar20 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_002a9194;
code_r0x002a908b:
  puVar20 = puVar20 + 1;
  puVar24 = puVar24 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_002a9073;
LAB_002a8955:
  lVar23 = lVar23 + (ulong)uVar18;
  piVar15 = (int *)source;
  if (uVar18 < uVar2) {
    piVar15 = piVar3;
  }
  iVar12 = uVar11 - uVar18;
  lVar4 = 0;
  cVar5 = (char)puVar24 * '\x10' + (char)puVar30 * -0x10;
  do {
    cVar26 = cVar5;
    lVar17 = lVar4;
    piVar9 = (int *)(lVar23 + lVar17);
    puVar28 = (ulong *)((long)puVar24 + lVar17);
    if ((piVar9 <= piVar15) || (puVar28 <= puVar30)) break;
    lVar4 = lVar17 + -1;
    cVar5 = cVar26 + -0x10;
  } while (*(char *)((long)puVar24 + lVar17 + -1) == *(char *)(lVar23 + -1 + lVar17));
  if ((uint)((iVar27 - (int)puVar30) + (int)lVar17) < 0xf) {
    puVar24 = (ulong *)(local_b0 + 1);
    *local_b0 = cVar26;
  }
  else {
    *local_b0 = -0x10;
    puVar24 = (ulong *)(local_b0 + 2);
    for (iVar27 = (int)lVar17 + (iVar27 - (int)puVar30) + -0xf; 0xfe < iVar27;
        iVar27 = iVar27 + -0xff) {
      *(char *)((long)puVar24 + -1) = -1;
      puVar24 = (ulong *)((long)puVar24 + 1);
    }
    *(char *)((long)puVar24 + -1) = (char)iVar27;
  }
  puVar16 = (ulong *)(((long)puVar28 - (long)puVar30 & 0xffffffffU) + (long)puVar24);
  do {
    *puVar24 = *puVar30;
    puVar24 = puVar24 + 1;
    puVar30 = puVar30 + 1;
  } while (puVar24 < puVar16);
  do {
    *(short *)puVar16 = (short)iVar12;
    if (piVar15 == piVar3) {
      puVar24 = (ulong *)((lVar29 - (long)piVar9) + (long)puVar28);
      if (puVar7 < puVar24) {
        puVar24 = puVar7;
      }
      puVar20 = (ulong *)((long)puVar28 + 4);
      puVar30 = (ulong *)(piVar9 + 1);
      puVar21 = puVar20;
      if ((ulong *)((long)puVar24 - 7U) <= puVar20) {
LAB_002a8bd8:
        iVar27 = ((int)puVar21 - (int)puVar28) + -4;
LAB_002a8be0:
        if (puVar21 < (ulong *)((long)puVar24 - 7U)) {
          if (*puVar30 == *puVar21) break;
          uVar22 = *puVar21 ^ *puVar30;
          uVar25 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar18 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar27;
        }
        else {
          if ((puVar21 < (ulong *)((long)puVar24 - 3U)) && ((int)*puVar30 == (int)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 4);
            puVar30 = (ulong *)((long)puVar30 + 4);
          }
          if ((puVar21 < (ulong *)((long)puVar24 - 1U)) && ((short)*puVar30 == (short)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 2);
            puVar30 = (ulong *)((long)puVar30 + 2);
          }
          if (puVar21 < puVar24) {
            puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar30 == (char)*puVar21));
          }
          uVar18 = (int)puVar21 - (int)puVar20;
        }
        goto LAB_002a8c49;
      }
      if (*puVar30 == *puVar20) {
        puVar30 = (ulong *)(piVar9 + 3);
        puVar21 = (ulong *)((long)puVar28 + 0xc);
        goto LAB_002a8bd8;
      }
      uVar25 = *puVar20 ^ *puVar30;
      lVar23 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar18 = (uint)lVar23 >> 3;
LAB_002a8c49:
      puVar30 = (ulong *)((long)puVar28 + (ulong)uVar18 + 4);
      if (puVar30 == puVar24) {
        puVar30 = puVar24;
        puVar20 = (ulong *)source;
        if (puVar1 <= puVar24) {
LAB_002a8c88:
          puVar28 = (ulong *)((long)puVar28 + (lVar29 - (long)piVar9));
          if (puVar7 <= puVar28) {
            puVar28 = puVar7;
          }
          iVar27 = (int)puVar30 - (int)puVar28;
LAB_002a8ca1:
          if (puVar30 < puVar1) {
            if (*puVar20 == *puVar30) goto code_r0x002a8cb5;
            uVar22 = *puVar30 ^ *puVar20;
            uVar25 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar11 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar27;
          }
          else {
            if ((puVar30 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar20 == (int)*puVar30))
            {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar30 < source + ((ulong)(uint)srcSize - 6)) &&
               ((short)*puVar20 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar30 < puVar7) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar20 == (char)*puVar30));
            }
            uVar11 = (int)puVar30 - (int)puVar24;
          }
          goto LAB_002a8cda;
        }
        if (*(ulong *)source == *puVar24) {
          puVar30 = puVar24 + 1;
          puVar20 = (ulong *)(source + 8);
          goto LAB_002a8c88;
        }
        uVar25 = *puVar24 ^ *(ulong *)source;
        lVar23 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        uVar11 = (uint)lVar23 >> 3;
LAB_002a8cda:
        uVar18 = uVar18 + uVar11;
        puVar30 = (ulong *)((long)puVar24 + (ulong)uVar11);
      }
    }
    else {
      puVar24 = (ulong *)((long)puVar28 + 4);
      puVar30 = (ulong *)(piVar9 + 1);
      puVar20 = puVar24;
      if (puVar1 <= puVar24) {
LAB_002a8b6a:
        iVar27 = ((int)puVar20 - (int)puVar28) + -4;
LAB_002a8b72:
        if (puVar20 < puVar1) {
          if (*puVar30 == *puVar20) goto code_r0x002a8b8a;
          uVar22 = *puVar20 ^ *puVar30;
          uVar25 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar18 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar27;
        }
        else {
          if ((puVar20 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar30 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar30 = (ulong *)((long)puVar30 + 4);
          }
          if ((puVar20 < source + ((ulong)(uint)srcSize - 6)) &&
             ((short)*puVar30 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar30 = (ulong *)((long)puVar30 + 2);
          }
          if (puVar20 < puVar7) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar30 == (char)*puVar20));
          }
          uVar18 = (int)puVar20 - (int)puVar24;
        }
        goto LAB_002a8c1e;
      }
      if (*puVar30 == *puVar24) {
        puVar30 = (ulong *)(piVar9 + 3);
        puVar20 = (ulong *)((long)puVar28 + 0xc);
        goto LAB_002a8b6a;
      }
      uVar25 = *puVar24 ^ *puVar30;
      lVar23 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar18 = (uint)lVar23 >> 3;
LAB_002a8c1e:
      puVar30 = (ulong *)((long)puVar28 + (ulong)uVar18 + 4);
    }
    dest = (char *)((long)puVar16 + 2);
    if (uVar18 < 0xf) {
      *local_b0 = *local_b0 + (char)uVar18;
    }
    else {
      *local_b0 = *local_b0 + '\x0f';
      dest[0] = -1;
      dest[1] = -1;
      dest[2] = -1;
      dest[3] = -1;
      lVar23 = 0;
      for (uVar11 = uVar18 - 0xf; 0x3fb < uVar11; uVar11 = uVar11 - 0x3fc) {
        pcVar31 = (char *)((long)puVar16 + lVar23 + 6);
        pcVar31[0] = -1;
        pcVar31[1] = -1;
        pcVar31[2] = -1;
        pcVar31[3] = -1;
        lVar23 = lVar23 + 4;
      }
      lVar4 = lVar23 + ((ulong)uVar11 & 0xffff) / 0xff;
      dest = (char *)((long)puVar16 + lVar4 + 3);
      *(char *)((long)puVar16 + lVar4 + 2) =
           (char)((ushort)uVar11 / 0xff) + (char)uVar18 + -0xf + (char)lVar23;
    }
    if (source + ((ulong)(uint)srcSize - 0xb) <= puVar30) goto LAB_002a9460;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar30 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar30 + -2) - iVar13;
    uVar25 = *puVar30 * -0x30e4432345000000 >> 0x34;
    uVar11 = (int)puVar30 - iVar13;
    uVar18 = *(uint *)((long)LZ4_dict + uVar25 * 4);
    piVar15 = (int *)source;
    lVar23 = lVar32;
    if (uVar18 < uVar2) {
      piVar15 = piVar3;
      lVar23 = lVar14;
    }
    piVar9 = (int *)(lVar23 + (ulong)uVar18);
    *(uint *)((long)LZ4_dict + uVar25 * 4) = uVar11;
    local_b0 = dest;
    if (((uVar18 < uVar2 - uVar19) || (uVar18 + 0xffff < uVar11)) || (*piVar9 != (int)*puVar30))
    goto LAB_002a88d9;
    puVar16 = (ulong *)(dest + 1);
    *dest = '\0';
    iVar12 = uVar11 - uVar18;
    puVar28 = puVar30;
  } while( true );
  puVar21 = puVar21 + 1;
  puVar30 = puVar30 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_002a8be0;
code_r0x002a8cb5:
  puVar30 = puVar30 + 1;
  puVar20 = puVar20 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_002a8ca1;
code_r0x002a8b8a:
  puVar20 = puVar20 + 1;
  puVar30 = puVar30 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_002a8b72;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}